

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrentqueue.h
# Opt level: O2

Block * __thiscall
moodycamel::ConcurrentQueue<unsigned_int,moodycamel::ConcurrentQueueDefaultTraits>::
requisition_block<(moodycamel::ConcurrentQueue<unsigned_int,moodycamel::ConcurrentQueueDefaultTraits>::AllocationMode)0>
          (ConcurrentQueue<unsigned_int,moodycamel::ConcurrentQueueDefaultTraits> *this)

{
  Block *pBVar1;
  
  pBVar1 = ConcurrentQueue<unsigned_int,_moodycamel::ConcurrentQueueDefaultTraits>::
           try_get_block_from_initial_pool
                     ((ConcurrentQueue<unsigned_int,_moodycamel::ConcurrentQueueDefaultTraits> *)
                      this);
  if (pBVar1 == (Block *)0x0) {
    pBVar1 = ConcurrentQueue<unsigned_int,_moodycamel::ConcurrentQueueDefaultTraits>::
             FreeList<moodycamel::ConcurrentQueue<unsigned_int,_moodycamel::ConcurrentQueueDefaultTraits>::Block>
             ::try_get((FreeList<moodycamel::ConcurrentQueue<unsigned_int,_moodycamel::ConcurrentQueueDefaultTraits>::Block>
                        *)(this + 0x28));
    if (pBVar1 == (Block *)0x0) {
      pBVar1 = create<moodycamel::ConcurrentQueue<unsigned_int,moodycamel::ConcurrentQueueDefaultTraits>::Block>
                         ();
      return pBVar1;
    }
  }
  return pBVar1;
}

Assistant:

Block* requisition_block()
	{
		auto block = try_get_block_from_initial_pool();
		if (block != nullptr) {
			return block;
		}
		
		block = try_get_block_from_free_list();
		if (block != nullptr) {
			return block;
		}
		
		if (canAlloc == CanAlloc) {
			return create<Block>();
		}
		
		return nullptr;
	}